

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  bool bVar1;
  ostream *poVar2;
  vector<int,_std::allocator<int>_> *__x;
  uint uVar3;
  ulong uVar4;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> ans;
  vector<int,_std::allocator<int>_> coeffs;
  Diophantine diophantine;
  Population population;
  vector<int,_std::allocator<int>_> local_128;
  vector<int,_std::allocator<int>_> local_110;
  vector<int,_std::allocator<int>_> local_f8;
  int local_e0;
  vector<int,_std::allocator<int>_> local_d8;
  Diophantine local_b8;
  Population local_98;
  
  local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x600000005;
  local_98.diophantine_.result = 7;
  local_98.diophantine_._28_4_ = 8;
  local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x200000001;
  local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x400000003;
  local_98.population_.super__Vector_base<DNA,_std::allocator<DNA>_>._M_impl.super__Vector_impl_data
  ._M_start._0_4_ = 9;
  __l._M_len = 9;
  __l._M_array = (iterator)&local_98;
  std::vector<int,_std::allocator<int>_>::vector(&local_110,__l,(allocator_type *)&local_f8);
  std::vector<int,_std::allocator<int>_>::vector(&local_d8,&local_110);
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_start;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_finish;
  local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
       (pointer)0x0;
  local_d8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_e0 = 10000;
  std::vector<int,_std::allocator<int>_>::vector(&local_b8.coeffs,&local_f8);
  local_b8.result = local_e0;
  Population::Population(&local_98,&local_b8,0.01,0x32);
  if (local_b8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_b8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_b8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_b8.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  uVar4 = 1;
  uVar3 = 0;
  while( true ) {
    bVar1 = Population::AnswerReady(&local_98);
    if (bVar1 || 49999 < uVar3) break;
    Population::evolve(&local_98);
    if ((int)(uVar4 / 100) * 100 - 1U == uVar3) {
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3 + 1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
    }
    uVar4 = (ulong)((int)uVar4 + 1);
    uVar3 = uVar3 + 1;
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"population size = ",0x12);
  poVar2 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"mutation rate = ",0x10);
  poVar2 = std::ostream::_M_insert<double>(0.01);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"iterations = ",0xd);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&std::cout,"answer is ready = ",0x12);
  Population::AnswerReady(&local_98);
  poVar2 = std::ostream::_M_insert<bool>(true);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  __x = Population::GetAnswer(&local_98);
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__x);
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_finish !=
      local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start) {
    uVar4 = 0;
    do {
      poVar2 = (ostream *)
               std::ostream::operator<<
                         ((ostream *)&std::cout,
                          local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start[uVar4]);
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"*",1);
      std::ostream::operator<<
                (poVar2,local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                        super__Vector_impl_data._M_start[uVar4]);
      uVar4 = uVar4 + 1;
      if (uVar4 != (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish -
                   (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start >> 2) {
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," + ",3);
      }
    } while (uVar4 < (ulong)((long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 2));
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout," = ",3);
  poVar2 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,10000);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\n",1);
  if (local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_128.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_98.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_98.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_98.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.answer.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::vector<DNA,_std::allocator<DNA>_>::~vector(&local_98.population_);
  if (local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_98.diophantine_.coeffs.super__Vector_base<int,_std::allocator<int>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_f8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_110.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return 0;
}

Assistant:

int main() {
    vector<int> coeffs = {1, 2, 3, 4, 5, 6, 7, 8, 9};
    int result = 10000;
    Diophantine diophantine(coeffs, result);
    Population population(diophantine, mutationRate, populationSize);

    int iterations = 0;

    while (!population.AnswerReady() && iterations < 50000) {
        ++iterations;
        population.evolve();
        if (iterations % 100 == 0) {
            cout << iterations << "\n";
        }
    }

    cout << "population size = " << populationSize << "\n";
    cout << "mutation rate = " << mutationRate << "\n";
    cout << "iterations = " << iterations << "\n";
    cout << "answer is ready = " << population.AnswerReady() << "\n";

    auto ans = population.GetAnswer();

    for (int i = 0; i < ans.size(); ++i) {
        cout << ans[i]  << "*"  << coeffs[i];
        if (i + 1 != ans.size()) {
            cout << " + ";
        }
    }
    cout << " = " << result << "\n";

    return 0;
}